

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other-tests.cpp
# Opt level: O3

int homoMatrixDerivationTestFromFile(char *homo,char *vel,string *prefix)

{
  pointer pcVar1;
  char cVar2;
  Index IVar3;
  double dVar4;
  undefined8 uVar5;
  Matrix<double,__1,__1,_0,__1,__1> *other;
  long lVar6;
  ostream *poVar7;
  _Elt_pointer pMVar8;
  _Elt_pointer pMVar9;
  long lVar10;
  Index *pIVar11;
  double *pdVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  IndexedMatrixArray computedVelocities;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  IndexedMatrixArray velocities;
  IndexedMatrixArray homoMatrices;
  AngleAxis aa;
  Matrix3 r1;
  Matrix3 r2;
  ofstream f2;
  ofstream f1;
  ofstream f;
  DenseStorage<double,__1,__1,__1,_0> local_9c8;
  long local_9a8;
  _Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  _Stack_9a0;
  long local_950;
  Matrix<double,__1,__1,_0,__1,__1> *local_948;
  double dStack_940;
  Matrix<double,__1,__1,_0,__1,__1> local_938;
  double dStack_920;
  double local_918;
  double dStack_910;
  double local_908;
  double dStack_900;
  double local_8f8;
  double dStack_8f0;
  double local_8e8;
  double dStack_8e0;
  double local_8d8;
  double dStack_8d0;
  undefined1 local_8c8 [24];
  double local_8b0;
  IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_8a8;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>
  local_848;
  IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_838;
  double local_7d8;
  double dStack_7d0;
  double local_7c8;
  undefined8 uStack_7c0;
  double local_7b8;
  double dStack_7b0;
  double local_7a8;
  double dStack_7a0;
  double local_798;
  double dStack_790;
  AngleAxis<double> local_788;
  double local_768 [6];
  double local_738;
  double dStack_730;
  double local_728;
  double dStack_720;
  double local_718;
  double dStack_710;
  undefined8 local_708;
  double dStack_700;
  double local_6f8;
  double dStack_6f0;
  QuaternionBase<Eigen::Quaternion<double,_0>_> local_6e8 [24];
  Index aIStack_6d0 [2];
  Matrix<double,_3,_3,_0,_3,_3> local_6c0;
  Matrix<double,_3,_3,_0,_3,_3> local_678;
  long local_630;
  filebuf local_628 [240];
  ios_base aiStack_538 [264];
  long local_430;
  filebuf local_428 [240];
  ios_base aiStack_338 [264];
  long local_230;
  filebuf local_228 [240];
  ios_base aiStack_138 [264];
  
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_8a8.k_ = 0;
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::_M_initialize_map(&local_8a8.v_.
                       super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ,0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::readFromFile(&local_8a8,vel,6,1,true);
  local_838.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_838.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_838.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_838.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_838.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_838.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_838.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_838.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_838.k_ = 0;
  local_838.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_838.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::_M_initialize_map(&local_838.v_.
                       super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ,0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::readFromFile(&local_838,homo,4,4,true);
  _Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  _Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  _Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  _Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  _Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  _Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  _Stack_9a0._M_impl.super__Deque_impl_data._M_map_size = 0;
  _Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_9a8 = 0;
  _Stack_9a0._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  _Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::_M_initialize_map(&_Stack_9a0,0);
  std::ofstream::ofstream(&local_230);
  std::ofstream::ofstream(&local_430);
  std::ofstream::ofstream(&local_630);
  local_948 = &local_938;
  pcVar1 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_948,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_948);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)local_948);
  if (local_948 != &local_938) {
    operator_delete(local_948);
  }
  local_948 = &local_938;
  pcVar1 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_948,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_948);
  std::ofstream::open((char *)&local_430,(_Ios_Openmode)local_948);
  if (local_948 != &local_938) {
    operator_delete(local_948);
  }
  local_948 = &local_938;
  pcVar1 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_948,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_948);
  std::ofstream::open((char *)&local_630,(_Ios_Openmode)local_948);
  lVar16 = local_838.k_;
  if (local_948 != &local_938) {
    operator_delete(local_948);
    lVar16 = local_838.k_;
  }
LAB_0010288e:
  uVar5 = _memcpy;
  lVar10 = _VTT;
  lVar15 = ((long)local_838.v_.
                  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)local_838.v_.
                  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555 +
           (((long)local_838.v_.
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node -
             (long)local_838.v_.
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
           (ulong)(local_838.v_.
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x15;
  lVar6 = ((long)local_838.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)local_838.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555;
  if (lVar15 + local_838.k_ + lVar6 + -1 <= lVar16) {
    local_630 = _VTT;
    *(undefined8 *)(local_628 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
    std::filebuf::~filebuf(local_628);
    std::ios_base::~ios_base(aiStack_538);
    local_430 = lVar10;
    *(undefined8 *)(local_428 + *(long *)(lVar10 + -0x18) + -8) = uVar5;
    std::filebuf::~filebuf(local_428);
    std::ios_base::~ios_base(aiStack_338);
    local_230 = lVar10;
    *(undefined8 *)(local_228 + *(long *)(lVar10 + -0x18) + -8) = uVar5;
    std::filebuf::~filebuf(local_228);
    std::ios_base::~ios_base(aiStack_138);
    std::
    deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&_Stack_9a0);
    std::
    deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~deque(&local_838.v_);
    std::
    deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~deque(&local_8a8.v_);
    return 0;
  }
  lVar15 = lVar15 + lVar6;
  if (((lVar15 == 0) || (lVar16 < local_838.k_)) ||
     (lVar15 = lVar15 + local_838.k_, lVar15 <= lVar16)) goto LAB_001034ef;
  lVar10 = ((long)local_838.v_.
                  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
            (long)local_838.v_.
                  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x5555555555555555;
  uVar14 = lVar10 + (lVar16 - local_838.k_);
  if ((long)uVar14 < 0) {
    uVar13 = ~(~uVar14 / 0x15);
LAB_00102981:
    pMVar9 = local_838.v_.
             super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node[uVar13] + uVar13 * -0x15 + uVar14;
  }
  else {
    if (0x14 < uVar14) {
      uVar13 = uVar14 / 0x15;
      goto LAB_00102981;
    }
    pMVar9 = local_838.v_.
             super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar16 - local_838.k_);
  }
  if (((pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
       != 4) ||
     ((pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
      4)) goto LAB_0010352d;
  pdVar12 = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_data;
  local_948 = (Matrix<double,__1,__1,_0,__1,__1> *)*pdVar12;
  dStack_940 = pdVar12[1];
  local_938.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)pdVar12[2];
  local_938.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       (Index)pdVar12[3];
  local_938.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)pdVar12[4];
  dStack_920 = pdVar12[5];
  local_918 = pdVar12[6];
  dStack_910 = pdVar12[7];
  local_908 = pdVar12[8];
  dStack_900 = pdVar12[9];
  local_8f8 = pdVar12[10];
  dStack_8f0 = pdVar12[0xb];
  local_798 = pdVar12[0xc];
  dStack_790 = pdVar12[0xd];
  local_8e8 = pdVar12[0xc];
  dStack_8e0 = pdVar12[0xd];
  local_7a8 = pdVar12[0xe];
  dStack_7a0 = pdVar12[0xf];
  local_8d8 = pdVar12[0xe];
  dStack_8d0 = pdVar12[0xf];
  lVar6 = lVar16 + 1;
  if (lVar15 <= lVar6) goto LAB_001034ef;
  uVar14 = lVar10 + (lVar6 - local_838.k_);
  if ((long)uVar14 < 0) {
    uVar13 = ~(~uVar14 / 0x15);
LAB_00102a8d:
    pMVar9 = local_838.v_.
             super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node[uVar13] + uVar13 * -0x15 + uVar14;
  }
  else {
    if (0x14 < uVar14) {
      uVar13 = uVar14 / 0x15;
      goto LAB_00102a8d;
    }
    pMVar9 = local_838.v_.
             super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar6 - local_838.k_);
  }
  local_950 = lVar6;
  if (((pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
       != 4) ||
     ((pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols !=
      4)) {
LAB_0010352d:
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 4, 4>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 4, 4>]"
                 );
  }
  pdVar12 = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_data;
  local_768[0] = *pdVar12;
  local_768[1] = pdVar12[1];
  local_768[2] = pdVar12[2];
  local_768[3] = pdVar12[3];
  local_768[4] = pdVar12[4];
  local_768[5] = pdVar12[5];
  local_738 = pdVar12[6];
  dStack_730 = pdVar12[7];
  local_728 = pdVar12[8];
  dStack_720 = pdVar12[9];
  local_718 = pdVar12[10];
  dStack_710 = pdVar12[0xb];
  local_8c8._0_16_ = *(undefined1 (*) [16])(pdVar12 + 0xc);
  local_708 = *(undefined8 *)*(undefined1 (*) [16])(pdVar12 + 0xc);
  dStack_700 = pdVar12[0xd];
  local_7b8 = pdVar12[0xe];
  dStack_7b0 = pdVar12[0xf];
  local_6f8 = pdVar12[0xe];
  dStack_6f0 = pdVar12[0xf];
  lVar10 = 0x10;
  pIVar11 = (Index *)&local_938;
  do {
    IVar3 = pIVar11[-1];
    *(Index *)((long)aIStack_6d0 + lVar10) = pIVar11[-2];
    *(Index *)((long)aIStack_6d0 + lVar10 + 8) = IVar3;
    *(Index *)((long)local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array + lVar10) = *pIVar11;
    lVar10 = lVar10 + 0x18;
    pIVar11 = pIVar11 + 4;
  } while (lVar10 != 0x58);
  lVar10 = 0x10;
  pdVar12 = local_768 + 2;
  do {
    dVar4 = pdVar12[-1];
    *(double *)
     ((long)local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar10 + 0x38) = pdVar12[-2];
    *(double *)
     ((long)local_6c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar10 + 0x40) = dVar4;
    *(double *)
     ((long)local_678.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array + lVar10) = *pdVar12;
    lVar10 = lVar10 + 0x18;
    pdVar12 = pdVar12 + 4;
  } while (lVar10 != 0x58);
  local_848.m_lhs = &local_678;
  local_848.m_rhs.m_matrix = &local_6c0;
  Eigen::internal::
  quaternionbase_assign_impl<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>,3,3>
  ::run<Eigen::Quaternion<double,0>>(local_6e8,&local_848);
  Eigen::AngleAxis<double>::operator=(&local_788,local_6e8);
  local_7c8 = local_788.m_angle / 0.005;
  uStack_7c0 = 0;
  local_8b0 = local_788.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[0] * local_7c8;
  local_7d8 = local_788.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1];
  dStack_7d0 = local_788.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
               m_storage.m_data.array[2];
  auVar17._0_8_ = (double)local_8c8._0_8_ - local_798;
  auVar17._8_8_ = (double)local_8c8._8_8_ - dStack_790;
  local_8c8._0_16_ = divpd(auVar17,_DAT_0010b060);
  local_9c8.m_data = (double *)0x0;
  local_9c8.m_rows = 0;
  local_9c8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_9c8,6,6,1);
  if (((local_9c8.m_rows != 6) || (local_9c8.m_cols != 1)) &&
     ((Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_9c8,6,6,1), local_9c8.m_rows != 6
      || (local_9c8.m_cols != 1)))) {
    __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 6, 1>, T1 = double, T2 = double]"
                 );
  }
  *local_9c8.m_data = (double)local_8c8._0_8_;
  local_9c8.m_data[1] = (double)local_8c8._8_8_;
  local_9c8.m_data[2] = (local_7b8 - local_7a8) / 0.005;
  local_9c8.m_data[3] = local_8b0;
  local_9c8.m_data[4] = local_7c8 * local_7d8;
  local_9c8.m_data[5] = local_7c8 * dStack_7d0;
  lVar10 = ((long)_Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)_Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
           -0x5555555555555555 +
           (((long)_Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_node -
             (long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
           (ulong)(_Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
           ) * 0x15;
  lVar6 = (long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_last -
          (long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_cur >> 3;
  lVar15 = lVar6 * -0x5555555555555555 + lVar10;
  if (lVar15 != 0) {
    lVar15 = lVar15 + local_9a8;
    uVar14 = lVar16 - local_9a8;
    if ((local_9a8 <= lVar16) && (lVar16 < lVar15)) {
      uVar13 = ((long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_first >> 3) *
               -0x5555555555555555 + uVar14;
      if ((long)uVar13 < 0) {
        uVar14 = ~(~uVar13 / 0x15);
LAB_00102de2:
        pMVar9 = _Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_node[uVar14] + uVar14 * -0x15
        ;
        uVar14 = uVar13;
      }
      else {
        pMVar9 = _Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (0x14 < uVar13) {
          uVar14 = uVar13 / 0x15;
          goto LAB_00102de2;
        }
      }
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                (pMVar9 + uVar14,(Matrix<double,__1,__1,_0,__1,__1> *)&local_9c8,
                 (assign_op<double,_double> *)&local_6c0);
      goto LAB_00102e05;
    }
    if (lVar15 != lVar16) {
      __assert_fail("(v_.size()==0 || k_+ TimeIndex(v_.size()) == time )&& \"Error: New time instants must be consecutive to existing ones\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                    ,0x1a2,
                    "void stateObservation::IndexedMatrixArrayT<>::checkNext_(TimeIndex) const [MatrixType = Eigen::Matrix<double, -1, -1>, Allocator = std::allocator<Eigen::Matrix<double, -1, -1>>]"
                   );
    }
  }
  if (lVar10 == lVar6 * 0x5555555555555555) {
    local_9a8 = lVar16;
  }
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::push_back((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)&_Stack_9a0,(value_type *)&local_9c8);
LAB_00102e05:
  free(local_9c8.m_data);
  poVar7 = std::ostream::_M_insert<long>((long)&local_230);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," \t ",3);
  lVar10 = 0;
  do {
    lVar6 = ((long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_last -
             (long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
            -0x5555555555555555 +
            ((long)_Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_cur -
             (long)_Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
            -0x5555555555555555 +
            (((long)_Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_node -
              (long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
            (ulong)(_Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0
                   )) * 0x15;
    if (((lVar6 == 0) || (uVar14 = lVar16 - local_9a8, lVar16 < local_9a8)) ||
       (local_9a8 + lVar6 <= lVar16)) goto LAB_001034ef;
    uVar13 = ((long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_first >> 3) *
             -0x5555555555555555 + uVar14;
    if ((long)uVar13 < 0) {
      uVar14 = ~(~uVar13 / 0x15);
LAB_00102ef9:
      pMVar9 = _Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_node[uVar14] + uVar14 * -0x15;
      uVar14 = uVar13;
    }
    else {
      pMVar9 = _Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (0x14 < uVar13) {
        uVar14 = uVar13 / 0x15;
        goto LAB_00102ef9;
      }
    }
    if (pMVar9[uVar14].super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_rows <= lVar10) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
    lVar6 = ((long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_last -
             (long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
            -0x5555555555555555 +
            ((long)_Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_cur -
             (long)_Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
            -0x5555555555555555 +
            (((long)_Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_node -
              (long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
            (ulong)(_Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0
                   )) * 0x15;
    if (((lVar6 == 0) || (uVar14 = lVar16 - local_9a8, lVar16 < local_9a8)) ||
       (local_9a8 + lVar6 <= lVar16)) goto LAB_001034ef;
    uVar13 = ((long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_first >> 3) *
             -0x5555555555555555 + uVar14;
    if ((long)uVar13 < 0) {
      uVar14 = ~(~uVar13 / 0x15);
LAB_00102fef:
      pMVar9 = _Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_node[uVar14] + uVar14 * -0x15;
      uVar14 = uVar13;
    }
    else {
      pMVar9 = _Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (0x14 < uVar13) {
        uVar14 = uVar13 / 0x15;
        goto LAB_00102fef;
      }
    }
    pMVar9 = pMVar9 + uVar14;
    lVar6 = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols * (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_rows;
    if (lVar6 - lVar10 == 0 || lVar6 < lVar10) goto LAB_0010350e;
    lVar6 = ((long)local_8a8.v_.
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_last -
             (long)local_8a8.v_.
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
            ((long)local_8a8.v_.
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur -
             (long)local_8a8.v_.
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555 +
            (((long)local_8a8.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node -
              (long)local_8a8.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
            (ulong)(local_8a8.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x15;
    if (((lVar6 == 0) || (uVar14 = lVar16 - local_8a8.k_, lVar16 < local_8a8.k_)) ||
       (local_8a8.k_ + lVar6 <= lVar16)) goto LAB_001034ef;
    uVar13 = ((long)local_8a8.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_8a8.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x5555555555555555 +
             uVar14;
    if ((long)uVar13 < 0) {
      uVar14 = ~(~uVar13 / 0x15);
LAB_001030f5:
      pMVar8 = local_8a8.v_.
               super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar14] + uVar14 * -0x15;
      uVar14 = uVar13;
    }
    else {
      pMVar8 = local_8a8.v_.
               super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (0x14 < uVar13) {
        uVar14 = uVar13 / 0x15;
        goto LAB_001030f5;
      }
    }
    pMVar8 = pMVar8 + uVar14;
    lVar6 = (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols * (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_rows;
    if (lVar6 - lVar10 == 0 || lVar6 < lVar10) {
LAB_0010350e:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                   );
    }
    std::ostream::_M_insert<double>
              ((pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data[lVar10] -
               (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data[lVar10]);
    lVar10 = lVar10 + 1;
  } while( true );
  cVar2 = (char)(ostream *)&local_230;
  std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
  std::ostream::put(cVar2);
  std::ostream::flush();
  poVar7 = std::ostream::_M_insert<long>((long)&local_430);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," \t ",3);
  lVar10 = ((long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_last -
            (long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) *
           -0x5555555555555555 +
           ((long)_Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_cur -
            (long)_Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
           -0x5555555555555555 +
           (((long)_Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_node -
             (long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
           (ulong)(_Stack_9a0._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)
           ) * 0x15;
  if (((lVar10 == 0) || (uVar14 = lVar16 - local_9a8, lVar16 < local_9a8)) ||
     (local_9a8 + lVar10 <= lVar16)) goto LAB_001034ef;
  uVar13 = ((long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_cur -
            (long)_Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_first >> 3) *
           -0x5555555555555555 + uVar14;
  if ((long)uVar13 < 0) {
    uVar14 = ~(~uVar13 / 0x15);
LAB_00103258:
    pMVar9 = _Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_node[uVar14] + uVar14 * -0x15;
    uVar14 = uVar13;
  }
  else {
    pMVar9 = _Stack_9a0._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (0x14 < uVar13) {
      uVar14 = uVar13 / 0x15;
      goto LAB_00103258;
    }
  }
  local_948 = pMVar9 + uVar14;
  poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                     *)&local_948);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  poVar7 = std::ostream::_M_insert<long>((long)&local_630);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," \t ",3);
  lVar10 = local_950;
  lVar6 = ((long)local_8a8.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last -
           (long)local_8a8.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
          ((long)local_8a8.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur -
           (long)local_8a8.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555 +
          (((long)local_8a8.v_.
                  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node -
            (long)local_8a8.v_.
                  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
          (ulong)(local_8a8.v_.
                  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x15;
  if (((lVar6 == 0) || (uVar14 = lVar16 - local_8a8.k_, lVar16 < local_8a8.k_)) ||
     (local_8a8.k_ + lVar6 <= lVar16)) {
LAB_001034ef:
    __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                  ,0x192,
                  "void stateObservation::IndexedMatrixArrayT<>::check_(TimeIndex) const [MatrixType = Eigen::Matrix<double, -1, -1>, Allocator = std::allocator<Eigen::Matrix<double, -1, -1>>]"
                 );
  }
  uVar13 = ((long)local_8a8.v_.
                  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur -
            (long)local_8a8.v_.
                  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x5555555555555555 +
           uVar14;
  if ((long)uVar13 < 0) {
    uVar14 = ~(~uVar13 / 0x15);
  }
  else {
    pMVar9 = local_8a8.v_.
             super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (uVar13 < 0x15) goto LAB_001033ce;
    uVar14 = uVar13 / 0x15;
  }
  pMVar9 = local_8a8.v_.
           super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node[uVar14] + uVar14 * -0x15;
  uVar14 = uVar13;
LAB_001033ce:
  local_948 = pMVar9 + uVar14;
  poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                     *)&local_948);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  lVar16 = lVar10;
  goto LAB_0010288e;
}

Assistant:

int homoMatrixDerivationTestFromFile(char * homo, char * vel, const std::string & prefix)
{
  IndexedMatrixArray velocities;
  velocities.readFromFile(vel, 6);
  IndexedMatrixArray homoMatrices;
  homoMatrices.readFromFile(homo, 4, 4);

  IndexedMatrixArray computedVelocities;

  std::ofstream f, f1, f2;
  f.open((prefix + "output.dat").c_str());
  f1.open((prefix + "computed.dat").c_str());
  f2.open((prefix + "real.dat").c_str());

  for(TimeIndex i = homoMatrices.getFirstIndex(); i < homoMatrices.getLastIndex(); ++i)
  {
    computedVelocities.setValue(kine::derivateHomogeneousMatrixFD(homoMatrices[i], homoMatrices[i + 1], dt), i);

    f << i << " \t ";
    for(long j = 0; j < computedVelocities[i].rows(); ++j)
    {
      f << " " << computedVelocities[i](j) - velocities[i](j);
    }

    f << std::endl;

    f1 << i << " \t " << computedVelocities[i].transpose() << std::endl;
    f2 << i << " \t " << velocities[i].transpose() << std::endl;
  }

  return 0;
}